

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

size_t mbedtls_ssl_get_max_frag_len(mbedtls_ssl_context *ssl)

{
  uint uVar1;
  
  uVar1 = *(uint *)((long)mfl_code_to_length + (ulong)(*(uint *)&ssl->conf->field_0x174 >> 5 & 0x1c)
                   );
  if ((ssl->session_out != (mbedtls_ssl_session *)0x0) &&
     (mfl_code_to_length[ssl->session_out->mfl_code] < uVar1)) {
    uVar1 = mfl_code_to_length[ssl->session_out->mfl_code];
  }
  return (ulong)uVar1;
}

Assistant:

size_t mbedtls_ssl_get_max_frag_len( const mbedtls_ssl_context *ssl )
{
    size_t max_len;

    /*
     * Assume mfl_code is correct since it was checked when set
     */
    max_len = mfl_code_to_length[ssl->conf->mfl_code];

    /*
     * Check if a smaller max length was negotiated
     */
    if( ssl->session_out != NULL &&
        mfl_code_to_length[ssl->session_out->mfl_code] < max_len )
    {
        max_len = mfl_code_to_length[ssl->session_out->mfl_code];
    }

    return max_len;
}